

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtFont.h
# Opt level: O3

string * __thiscall
ft::Font::getFamilyNameOr(string *__return_storage_ptr__,Font *this,string *defaultName)

{
  char *__s;
  pointer pcVar1;
  size_t sVar2;
  
  __s = this->face->family_name;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (__s == (char *)0x0) {
    pcVar1 = (defaultName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + defaultName->_M_string_length);
  }
  else {
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFamilyNameOr(const std::string& defaultName) const
    {
        if (!face->family_name)
            return defaultName;
        return std::string(face->family_name);
    }